

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void error<long,long>(char *fmtstr,long *args,long *args_1)

{
  String local_60;
  String local_40;
  long *local_20;
  long *args_local_1;
  long *args_local;
  char *fmtstr_local;
  
  local_20 = args_1;
  args_local_1 = args;
  args_local = (long *)fmtstr;
  String::String(&local_60,fmtstr);
  format<long,long>(&local_40,&local_60,args_local_1,local_20);
  error(&local_40);
  String::~String(&local_40);
  String::~String(&local_60);
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}